

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_mem(char **strp,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  LY_ERR *pLVar2;
  lyout local_38;
  
  if (strp == (char **)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    iVar1 = 1;
  }
  else {
    local_38.type = LYOUT_MEMORY;
    local_38.method.f = (FILE *)0x0;
    local_38.method.mem.len = 0;
    local_38.method.mem.size = 0;
    iVar1 = lyd_print_(&local_38,root,format,options);
    *strp = (char *)local_38.method.f;
  }
  return iVar1;
}

Assistant:

API int
lyd_print_mem(char **strp, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;
    int r;

    if (!strp) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_MEMORY;
    out.method.mem.buf = NULL;
    out.method.mem.len = 0;
    out.method.mem.size = 0;

    r = lyd_print_(&out, root, format, options);

    *strp = out.method.mem.buf;
    return r;
}